

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloth_decorator.h
# Opt level: O0

void __thiscall
decorator::ClothDecorator::ClothDecorator(ClothDecorator *this,shared_ptr<decorator::Human> *human)

{
  shared_ptr<decorator::Human> local_28;
  shared_ptr<decorator::Human> *local_18;
  shared_ptr<decorator::Human> *human_local;
  ClothDecorator *this_local;
  
  local_18 = human;
  human_local = (shared_ptr<decorator::Human> *)this;
  std::shared_ptr<decorator::Human>::shared_ptr(&local_28,human);
  WomenDecorator::WomenDecorator(&this->super_WomenDecorator,&local_28);
  std::shared_ptr<decorator::Human>::~shared_ptr(&local_28);
  (this->super_WomenDecorator).super_Human._vptr_Human = (_func_int **)&PTR_Outlook_0019e7a8;
  return;
}

Assistant:

ClothDecorator::ClothDecorator(std::shared_ptr<Human> human)
        : WomenDecorator(human) {}